

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

type_info * pybind11::detail::get_type_info(type_index *tp,bool throw_if_missing)

{
  type_info *ptVar1;
  undefined1 local_78 [8];
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ptVar1 = get_local_type_info(tp);
  if (ptVar1 == (type_info *)0x0) {
    ptVar1 = get_global_type_info(tp);
    if (throw_if_missing && ptVar1 == (type_info *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,
                 *(char **)(tp->_M_target + 8) + (**(char **)(tp->_M_target + 8) == '*'),
                 (allocator<char> *)&local_38);
      clean_type_id((string *)local_78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tname.field_2 + 8),
                     "pybind11::detail::get_type_info: unable to find type info for \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tname.field_2 + 8),"\"");
      pybind11_fail(&local_38);
    }
  }
  return ptVar1;
}

Assistant:

PYBIND11_NOINLINE detail::type_info *get_type_info(const std::type_index &tp,
                                                          bool throw_if_missing = false) {
    if (auto ltype = get_local_type_info(tp))
        return ltype;
    if (auto gtype = get_global_type_info(tp))
        return gtype;

    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}